

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::Swap(RepeatedField<bool> *this,RepeatedField<bool> *other)

{
  RepeatedField<bool> *this_00;
  RepeatedField<bool> *pRVar1;
  Arena *arena;
  long in_RSI;
  long in_RDI;
  RepeatedField<bool> temp;
  RepeatedField<bool> *in_stack_00000078;
  RepeatedField<bool> *in_stack_00000080;
  RepeatedField<bool> *in_stack_ffffffffffffffc0;
  RepeatedField<bool> local_20 [2];
  
  if (in_RDI != in_RSI) {
    this_00 = (RepeatedField<bool> *)GetArena(in_stack_ffffffffffffffc0);
    pRVar1 = (RepeatedField<bool> *)GetArena(this_00);
    if (this_00 == pRVar1) {
      InternalSwap(in_stack_00000080,in_stack_00000078);
    }
    else {
      arena = GetArena(this_00);
      pRVar1 = local_20;
      RepeatedField(pRVar1,arena);
      MergeFrom(this,other);
      CopyFrom(this_00,pRVar1);
      UnsafeArenaSwap(this_00,pRVar1);
      ~RepeatedField(this_00);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArena() == other->GetArena()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArena());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}